

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O0

void Gia_Iso3Compute(Gia_Man_t *p,Vec_Int_t *vSign)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vSign_local;
  Gia_Man_t *p_local;
  
  local_24 = 0;
  do {
    bVar3 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar3 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) {
      return;
    }
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pGStack_20);
      if (iVar1 != 0) goto LAB_008fc46a;
    }
    else {
LAB_008fc46a:
      pGVar2 = Gia_ObjFanin0(pGStack_20);
      iVar1 = Gia_ObjFaninC0(pGStack_20);
      Gia_Iso3ComputeEdge(p,pGStack_20,pGVar2,iVar1,vSign);
    }
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 != 0) {
      pGVar2 = Gia_ObjFanin1(pGStack_20);
      iVar1 = Gia_ObjFaninC1(pGStack_20);
      Gia_Iso3ComputeEdge(p,pGStack_20,pGVar2,iVar1,vSign);
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Gia_Iso3Compute( Gia_Man_t * p, Vec_Int_t * vSign )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
            Gia_Iso3ComputeEdge( p, pObj, Gia_ObjFanin0(pObj), Gia_ObjFaninC0(pObj), vSign );
        if ( Gia_ObjIsAnd(pObj) )
            Gia_Iso3ComputeEdge( p, pObj, Gia_ObjFanin1(pObj), Gia_ObjFaninC1(pObj), vSign );
    }
}